

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::detail::ClassSpecializationKey::ClassSpecializationKey
          (ClassSpecializationKey *this,
          span<const_slang::ConstantValue_*const,_18446744073709551615UL> paramValues,
          span<const_slang::ast::Type_*const,_18446744073709551615UL> typeParams)

{
  bool bVar1;
  reference ppCVar2;
  reference ppTVar3;
  pointer in_RCX;
  size_t in_RDX;
  Type *in_RSI;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *in_RDI;
  size_t in_R8;
  Type *type;
  iterator __end2_1;
  iterator __begin2_1;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *__range2_1;
  ConstantValue *val;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ConstantValue_*const,_18446744073709551615UL> *__range2;
  size_t h;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *in_stack_ffffffffffffff68;
  __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff70;
  ConstantValue *in_stack_ffffffffffffff80;
  __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
  local_68;
  undefined1 *local_60;
  __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
  *local_58;
  ConstantValue *local_50;
  ConstantValue **local_48;
  __normal_iterator<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
  local_40;
  undefined1 *local_38;
  pointer local_30;
  undefined1 local_20 [16];
  
  in_RDI->_M_ptr = (pointer)in_RSI;
  (in_RDI->_M_extent)._M_extent_value = in_RDX;
  in_RDI[1]._M_ptr = in_RCX;
  in_RDI[1]._M_extent._M_extent_value = in_R8;
  local_30 = (pointer)0x0;
  local_38 = &stack0xfffffffffffffff0;
  local_40._M_current =
       (ConstantValue **)
       std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ConstantValue_*const,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff68);
  local_48 = (ConstantValue **)
             std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>::end
                       ((span<const_slang::ConstantValue_*const,_18446744073709551615UL> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff68);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
              ::operator*(&local_40);
    local_50 = *ppCVar2;
    if (local_50 == (ConstantValue *)0x0) {
      in_stack_ffffffffffffff70 =
           (__normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
            *)0x0;
    }
    else {
      in_stack_ffffffffffffff70 =
           (__normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
            *)slang::ConstantValue::hash(in_stack_ffffffffffffff80);
    }
    local_58 = in_stack_ffffffffffffff70;
    hash_combine<unsigned_long>
              ((size_t *)in_stack_ffffffffffffff70,(unsigned_long *)in_stack_ffffffffffffff68);
    __gnu_cxx::
    __normal_iterator<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
    ::operator++(&local_40);
  }
  local_60 = local_20;
  local_68._M_current =
       (Type **)std::span<const_slang::ast::Type_*const,_18446744073709551615UL>::begin
                          (in_stack_ffffffffffffff68);
  std::span<const_slang::ast::Type_*const,_18446744073709551615UL>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff68);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
              ::operator*(&local_68);
    if (*ppTVar3 == (Type *)0x0) {
      in_stack_ffffffffffffff68 = (span<const_slang::ast::Type_*const,_18446744073709551615UL> *)0x0
      ;
    }
    else {
      in_stack_ffffffffffffff68 =
           (span<const_slang::ast::Type_*const,_18446744073709551615UL> *)Type::hash(in_RSI);
    }
    hash_combine<unsigned_long>
              ((size_t *)in_stack_ffffffffffffff70,(unsigned_long *)in_stack_ffffffffffffff68);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
    ::operator++(&local_68);
  }
  in_RDI[2]._M_ptr = local_30;
  return;
}

Assistant:

ClassSpecializationKey::ClassSpecializationKey(std::span<const ConstantValue* const> paramValues,
                                               std::span<const Type* const> typeParams) :
    paramValues(paramValues), typeParams(typeParams) {

    // Precompute the hash.
    size_t h = 0;
    for (auto val : paramValues)
        hash_combine(h, val ? val->hash() : 0);
    for (auto type : typeParams)
        hash_combine(h, type ? type->hash() : 0);
    savedHash = h;
}